

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_task_test.c
# Opt level: O2

void * task_worker(void *arg)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  bool bVar5;
  MppTask task;
  
  task = (MppTask)0x0;
  uVar2 = mpp_task_queue_get_port(input,1);
  uVar3 = mpp_task_queue_get_port(output,0);
  iVar4 = 10000;
  do {
    bVar5 = iVar4 == 0;
    iVar4 = iVar4 + -1;
    if (bVar5) {
      return (void *)0x0;
    }
    iVar1 = _mpp_port_poll("task_worker",uVar2,0xffffffffffffffff);
  } while (((((((-1 < iVar1) ||
               (_mpp_log_l(2,0,"Assertion %s failed at %s:%d\n",0,"ret >= 0","task_worker",0x72),
               (DAT_0010608b & 0x10) == 0)) &&
              ((iVar1 = _mpp_port_dequeue("task_worker",uVar2,&task), iVar1 == 0 ||
               (_mpp_log_l(2,0,"Assertion %s failed at %s:%d\n",0,"!ret","task_worker",0x75),
               (DAT_0010608b & 0x10) == 0)))) &&
             ((task != (MppTask)0x0 ||
              (_mpp_log_l(2,0,"Assertion %s failed at %s:%d\n",0,"task","task_worker",0x76),
              (DAT_0010608b & 0x10) == 0)))) &&
            ((iVar1 = _mpp_port_enqueue("task_worker",uVar2,task), iVar1 == 0 ||
             (_mpp_log_l(2,0,"Assertion %s failed at %s:%d\n",0,"!ret","task_worker",0x79),
             (DAT_0010608b & 0x10) == 0)))) &&
           ((((iVar1 = _mpp_port_poll("task_worker",uVar3,0xffffffffffffffff), -1 < iVar1 ||
              (_mpp_log_l(2,0,"Assertion %s failed at %s:%d\n",0,"ret >= 0","task_worker",0x7c),
              (DAT_0010608b & 0x10) == 0)) &&
             ((iVar1 = _mpp_port_dequeue("task_worker",uVar3,&task), iVar1 == 0 ||
              (_mpp_log_l(2,0,"Assertion %s failed at %s:%d\n",0,"!ret","task_worker",0x7f),
              (DAT_0010608b & 0x10) == 0)))) &&
            ((task != (MppTask)0x0 ||
             (_mpp_log_l(2,0,"Assertion %s failed at %s:%d\n",0,"task","task_worker",0x80),
             (DAT_0010608b & 0x10) == 0)))))) &&
          ((iVar1 = _mpp_port_enqueue("task_worker",uVar3,task), iVar1 == 0 ||
           (_mpp_log_l(2,0,"Assertion %s failed at %s:%d\n",0,"!ret","task_worker",0x83),
           (DAT_0010608b & 0x10) == 0))));
  abort();
}

Assistant:

void *task_worker(void *arg)
{
    RK_S32 i;
    MppTask task = NULL;
    MPP_RET ret = MPP_OK;
    MppPort port_src = mpp_task_queue_get_port(input, MPP_PORT_OUTPUT);
    MppPort port_dst = mpp_task_queue_get_port(output, MPP_PORT_INPUT);

    for (i = 0; i < MAX_TASK_LOOP; i++) {
        ret = mpp_port_poll(port_src, MPP_POLL_BLOCK);
        mpp_assert(ret >= 0);

        ret = mpp_port_dequeue(port_src, &task);
        mpp_assert(!ret);
        mpp_assert(task);

        ret = mpp_port_enqueue(port_src, task);
        mpp_assert(!ret);

        ret = mpp_port_poll(port_dst, MPP_POLL_BLOCK);
        mpp_assert(ret >= 0);

        ret = mpp_port_dequeue(port_dst, &task);
        mpp_assert(!ret);
        mpp_assert(task);

        ret = mpp_port_enqueue(port_dst, task);
        mpp_assert(!ret);
    }

    (void)arg;
    return NULL;
}